

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O1

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::set_color
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,level_enum color_level,
          string_view_t color)

{
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,color.data_,color.data_ + color.size_);
  std::__cxx11::string::operator=
            ((string *)((this->colors_)._M_elems + color_level),(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level, string_view_t color)
{
    std::lock_guard<mutex_t> lock(mutex_);
    colors_[color_level] = to_string_(color);
}